

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.c
# Opt level: O1

apx_error_t
apx_nodeData_create_provide_port_data
          (apx_nodeData_t *self,apx_size_t num_ports,uint8_t *init_data,apx_size_t data_size)

{
  uint8_t *__s;
  ulong __size;
  apx_error_t aVar1;
  
  aVar1 = 1;
  if (((self != (apx_nodeData_t *)0x0) && (aVar1 = 10, self->is_weak_ref == false)) &&
     (aVar1 = 1, data_size != 0)) {
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    __size = (ulong)data_size;
    __s = (uint8_t *)malloc(__size);
    self->provide_port_data = __s;
    if (__s == (uint8_t *)0x0) {
      aVar1 = 2;
    }
    else {
      self->num_provide_ports = num_ports;
      self->provide_port_data_size = data_size;
      if (init_data == (uint8_t *)0x0) {
        aVar1 = 0;
        memset(__s,0,__size);
      }
      else {
        memcpy(__s,init_data,__size);
        aVar1 = 0;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
  }
  return aVar1;
}

Assistant:

apx_error_t apx_nodeData_create_provide_port_data(apx_nodeData_t* self, apx_size_t num_ports, uint8_t const* init_data, apx_size_t data_size)
{
   if (self != NULL)
   {
      if (self->is_weak_ref)
      {
         return APX_UNSUPPORTED_ERROR;
      }
      if (data_size > 0u)
      {
         MUTEX_LOCK(self->lock);
         self->provide_port_data = (uint8_t*)malloc(data_size);
         if (self->provide_port_data == NULL)
         {
            MUTEX_UNLOCK(self->lock);
            return APX_MEM_ERROR;
         }
         self->num_provide_ports = num_ports;
         self->provide_port_data_size = data_size;
         if (init_data != NULL)
         {
            memcpy(self->provide_port_data, init_data, data_size);
         }
         else
         {
            memset(self->provide_port_data, 0, data_size);
         }
         MUTEX_UNLOCK(self->lock);
         return APX_NO_ERROR;
      }
   }
   return APX_INVALID_ARGUMENT_ERROR;
}